

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtilStats.h
# Opt level: O1

void WriteHeaderInOutput(FILE *f,Parameters *params,CGraph *cg,Count triangle_count)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar2 = "false";
  pcVar3 = "false";
  if (params->normalization_count_available != false) {
    pcVar3 = "true";
  }
  pcVar4 = "false";
  if (params->CSS != false) {
    pcVar4 = "true";
  }
  if (params->NB != false) {
    pcVar2 = "true";
  }
  fprintf((FILE *)f,"#Filename = %s , Algo name = %s, edge count available=%s, CSS = %s, NB=%s \n",
          (params->filename)._M_dataplus._M_p,(params->algo_name)._M_dataplus._M_p,pcVar3,pcVar4,
          pcVar2);
  fwrite("########################\n",0x19,1,(FILE *)f);
  fprintf((FILE *)f,"#Algorithm : %s\n",(params->algo_name)._M_dataplus._M_p);
  fwrite("########################\n",0x19,1,(FILE *)f);
  fwrite("vertices,edges,triangles\n",0x19,1,(FILE *)f);
  fprintf((FILE *)f,"%lld,%lld,%lld\n",cg->nVertices,cg->nEdges,triangle_count);
  fwrite("no_of_repeat,seed_count,seed_vertex,degree_of_seed_vertex,walk_length,subsample_size,sparsification_prob\n"
         ,0x69,1,(FILE *)f);
  lVar1 = *(params->seed_vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  fprintf((FILE *)f,"%d,%lld,%lld,%lld,%lld,%lld,%lf\n",params->sparsification_prob,
          (ulong)(uint)params->no_of_repeat,params->seed_count,lVar1,
          cg->offsets[lVar1 + 1] - cg->offsets[lVar1],params->walk_length,
          (int)params->subsample_size);
  return;
}

Assistant:

void WriteHeaderInOutput(FILE *f, Parameters params, CGraph *cg, Count triangle_count) {
    fprintf(f, "#Filename = %s , Algo name = %s, "
               "edge count available=%s, CSS = %s, NB=%s \n",
            params.filename.c_str(), params.algo_name.c_str(),
            params.normalization_count_available ? "true":"false",
            params.CSS ? "true":"false",
            params.NB ? "true":"false");
    fprintf(f, "########################\n");
    fprintf(f, "#Algorithm : %s\n",params.algo_name.c_str());
    fprintf(f, "########################\n");
    fprintf(f, "vertices,edges,triangles\n");
    fprintf(f, "%lld,%lld,%lld\n", cg->nVertices, cg->nEdges, triangle_count);
    fprintf(f, "no_of_repeat,seed_count,seed_vertex,degree_of_seed_vertex,"
               "walk_length,subsample_size,sparsification_prob\n");
    fprintf(f, "%d,%lld,%lld,%lld,%lld,%lld,%lf\n",params.no_of_repeat, params.seed_count, params.seed_vertices[0],
            cg->degree(params.seed_vertices[0]),params.walk_length,
            params.subsample_size, params.sparsification_prob);

}